

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::TrackEventStateTracker::ParsedTrackEvent::ParsedTrackEvent
          (ParsedTrackEvent *this,Decoder *track_event_)

{
  this->track_event = track_event_;
  this->timestamp_ns = 0;
  this->duration_ns = 0;
  this->stack_depth = 0;
  (this->category).data = (char *)0x0;
  (this->category).size = 0;
  (this->name).data = (char *)0x0;
  (this->name).size = 0;
  this->name_hash = 0;
  return;
}

Assistant:

TrackEventStateTracker::ParsedTrackEvent::ParsedTrackEvent(
    const perfetto::protos::pbzero::TrackEvent::Decoder& track_event_)
    : track_event(track_event_) {}